

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O2

void __thiscall
ipx::IPM::SolveNewtonSystem
          (IPM *this,double *rb,double *rc,double *rl,double *ru,double *sl,double *su,Step *step)

{
  double **ppdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  Iterate *pIVar7;
  Model *pMVar8;
  Iterate *pIVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  Vector *y;
  double **ppdVar13;
  ulong uVar14;
  long lVar15;
  double **ppdVar16;
  ulong uVar17;
  size_t __n;
  ulong uVar18;
  Int j;
  double dVar19;
  double dVar20;
  Vector rhs2;
  Vector rhs1;
  valarray<double> local_58;
  valarray<double> local_48;
  double local_38;
  
  pIVar7 = this->iterate_;
  pMVar8 = pIVar7->model_;
  iVar5 = pMVar8->num_rows_;
  __n = (size_t)iVar5;
  uVar17 = (long)pMVar8->num_cols_ + __n;
  std::valarray<double>::valarray(&local_48,uVar17);
  std::valarray<double>::valarray(&local_58,__n);
  if (rc == (double *)0x0) {
    uVar18 = 0;
    if (0 < (int)uVar17) {
      uVar18 = uVar17 & 0xffffffff;
    }
  }
  else {
    uVar14 = 0;
    uVar18 = uVar17 & 0xffffffff;
    if ((int)uVar17 < 1) {
      uVar18 = uVar14;
    }
    for (; uVar18 != uVar14; uVar14 = uVar14 + 1) {
      local_48._M_data[uVar14] = -rc[uVar14];
    }
  }
  y = &step->y;
  pIVar9 = this->iterate_;
  lVar2 = uVar18 * 4;
  for (lVar15 = 0; lVar2 - lVar15 != 0; lVar15 = lVar15 + 4) {
    dVar19 = 0.0;
    dVar20 = 0.0;
    if (rl != (double *)0x0) {
      dVar20 = *(double *)((long)rl + lVar15 * 2);
    }
    if (ru != (double *)0x0) {
      dVar19 = *(double *)((long)ru + lVar15 * 2);
    }
    uVar6 = *(uint *)((long)(pIVar9->variable_state_).
                            super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar15);
    if ((uVar6 & 0xfffffffd) == 0) {
      *(double *)((long)local_48._M_data + lVar15 * 2) =
           (dVar20 * *(double *)((long)(pIVar7->zl_)._M_data + lVar15 * 2) +
           *(double *)((long)sl + lVar15 * 2)) /
           *(double *)((long)(pIVar7->xl_)._M_data + lVar15 * 2) +
           *(double *)((long)local_48._M_data + lVar15 * 2);
    }
    if (uVar6 - 1 < 2) {
      *(double *)((long)local_48._M_data + lVar15 * 2) =
           *(double *)((long)local_48._M_data + lVar15 * 2) -
           (*(double *)((long)su + lVar15 * 2) -
           dVar19 * *(double *)((long)(pIVar7->zu_)._M_data + lVar15 * 2)) /
           *(double *)((long)(pIVar7->xu_)._M_data + lVar15 * 2);
    }
    else if (uVar6 == 4) {
      *(undefined8 *)((long)local_48._M_data + lVar15 * 2) = 0;
    }
  }
  if ((rb != (double *)0x0) && (iVar5 != 0)) {
    if ((double *)local_58._M_size != (double *)0x0) {
      local_58._M_size = (size_t)local_58._M_data;
    }
    memmove((void *)local_58._M_size,rb,__n << 3);
  }
  dVar20 = (this->control_->parameters_).super_ipx_parameters.kkt_tol;
  dVar19 = Iterate::mu(this->iterate_);
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  KKTSolver::Solve(this->kkt_,&local_48,&local_58,dVar20 * dVar19,&step->x,y,this->info_);
  if ((this->info_->super_ipx_info).errflag == 0) {
    local_38 = -1.0;
    std::valarray<double>::operator*=(y,&local_38);
    pIVar9 = this->iterate_;
    pdVar10 = (step->x)._M_data;
    pdVar11 = (step->xl)._M_data;
    ppdVar1 = &(step->zl)._M_data;
    pdVar12 = (step->zl)._M_data;
    for (lVar15 = 0; lVar2 - lVar15 != 0; lVar15 = lVar15 + 4) {
      iVar5 = *(int *)((long)(pIVar9->variable_state_).
                             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar15);
      if (((iVar5 - 5U < 3) || (iVar5 == 3)) || (iVar5 == 4)) {
        *(undefined8 *)((long)pdVar11 + lVar15 * 2) = 0;
        dVar20 = 0.0;
      }
      else {
        if (rl == (double *)0x0) {
          dVar20 = 0.0;
        }
        else {
          dVar20 = *(double *)((long)rl + lVar15 * 2);
        }
        dVar20 = *(double *)((long)pdVar10 + lVar15 * 2) - dVar20;
        *(double *)((long)pdVar11 + lVar15 * 2) = dVar20;
        dVar20 = (*(double *)((long)sl + lVar15 * 2) -
                 dVar20 * *(double *)((long)(pIVar7->zl_)._M_data + lVar15 * 2)) /
                 *(double *)((long)(pIVar7->xl_)._M_data + lVar15 * 2);
      }
      *(double *)((long)pdVar12 + lVar15 * 2) = dVar20;
    }
    pIVar9 = this->iterate_;
    pdVar10 = (step->x)._M_data;
    pdVar11 = (step->xu)._M_data;
    pdVar12 = (step->zu)._M_data;
    ppdVar16 = &(step->zu)._M_data;
    for (lVar15 = 0; lVar2 - lVar15 != 0; lVar15 = lVar15 + 4) {
      iVar5 = *(int *)((long)(pIVar9->variable_state_).
                             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar15);
      if (((iVar5 - 5U < 3) || (iVar5 == 3)) || (iVar5 == 4)) {
        *(undefined8 *)((long)pdVar11 + lVar15 * 2) = 0;
        dVar20 = 0.0;
      }
      else {
        if (ru == (double *)0x0) {
          dVar20 = 0.0;
        }
        else {
          dVar20 = *(double *)((long)ru + lVar15 * 2);
        }
        dVar20 = dVar20 - *(double *)((long)pdVar10 + lVar15 * 2);
        *(double *)((long)pdVar11 + lVar15 * 2) = dVar20;
        dVar20 = (*(double *)((long)su + lVar15 * 2) -
                 dVar20 * *(double *)((long)(pIVar7->zu_)._M_data + lVar15 * 2)) /
                 *(double *)((long)(pIVar7->xu_)._M_data + lVar15 * 2);
      }
      *(double *)((long)pdVar12 + lVar15 * 2) = dVar20;
    }
    for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      if (4 < (this->iterate_->variable_state_).
              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17] - FREE) {
        dVar20 = DotColumn(&pMVar8->AI_,(Int)uVar17,y);
        if (rc == (double *)0x0) {
          dVar19 = 0.0;
        }
        else {
          dVar19 = rc[uVar17];
        }
        dVar3 = (pIVar7->xl_)._M_data[uVar17];
        if ((0x7fefffffffffffff < (ulong)ABS(dVar3)) ||
           ((dVar4 = (pIVar7->xu_)._M_data[uVar17], (ulong)ABS(dVar4) < 0x7ff0000000000000 &&
            (dVar4 * (pIVar7->zl_)._M_data[uVar17] < dVar3 * (pIVar7->zu_)._M_data[uVar17])))) {
          dVar20 = dVar20 + ((*ppdVar1)[uVar17] - dVar19);
          ppdVar13 = ppdVar16;
        }
        else {
          dVar20 = (dVar19 + (*ppdVar16)[uVar17]) - dVar20;
          ppdVar13 = ppdVar1;
        }
        (*ppdVar13)[uVar17] = dVar20;
      }
    }
  }
  operator_delete(local_58._M_data);
  operator_delete(local_48._M_data);
  return;
}

Assistant:

void IPM::SolveNewtonSystem(const double* rb, const double* rc,
                                    const double* rl, const double* ru,
                                    const double* sl, const double* su,
                                    Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    Vector& dx = step.x;
    Vector& dxl = step.xl;
    Vector& dxu = step.xu;
    Vector& dy = step.y;
    Vector& dzl = step.zl;
    Vector& dzu = step.zu;

    // Build RHS for KKT system.
    Vector rhs1(n+m), rhs2(m);
    if (rc) {
        for (Int j = 0; j < n+m; j++)
            rhs1[j] = -rc[j];
    }
    for (Int j = 0; j < n+m; j++) {
        double rlj = rl ? rl[j] : 0.0;
        double ruj = ru ? ru[j] : 0.0;
        if (iterate_->has_barrier_lb(j))
            rhs1[j] += (sl[j] + zl[j]*rlj) / xl[j];
        if (iterate_->has_barrier_ub(j))
            rhs1[j] -= (su[j] - zu[j]*ruj) / xu[j];
        if (iterate_->StateOf(j) == Iterate::State::fixed)
            rhs1[j] = 0.0;
    }
    assert(AllFinite(rhs1));
    if (rb)
        std::copy(rb, rb+m, std::begin(rhs2));

    // Solve KKT system.
    double tol =  control_.kkt_tol() * std::sqrt(iterate_->mu());
    kkt_->Solve(rhs1, rhs2, tol, dx, dy, info_);
    if (info_->errflag)
        return;

    // Recover solution to Newton system.
    dy *= -1.0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!rl || rl[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else {
            double rlj = rl ? rl[j] : 0.0;
            dxl[j] = dx[j] - rlj;
            dzl[j] = (sl[j] - zl[j]*dxl[j]) / xl[j];
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!ru || ru[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else {
            double ruj = ru ? ru[j] : 0.0;
            dxu[j] = ruj - dx[j];
            dzu[j] = (su[j] - zu[j]*dxu[j]) / xu[j];
        }
    }
    assert(AllFinite(dxl));
    assert(AllFinite(dxu));
    assert(AllFinite(dzl));
    assert(AllFinite(dzu));

    // Shift residual to the last two block equations.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::barrier) {
            assert(std::isfinite(xl[j]) || std::isfinite(xu[j]));
            double atdy = DotColumn(AI, j, dy);
            double rcj = rc ? rc[j] : 0.0;
            if (std::isfinite(xl[j]) && std::isfinite(xu[j])) {
                if (zl[j]*xu[j] >= zu[j]*xl[j])
                    dzl[j] = rcj + dzu[j] - atdy;
                else
                    dzu[j] = -rcj + dzl[j] + atdy;
            } else if (std::isfinite(xl[j])) {
                dzl[j] = rcj + dzu[j] - atdy;
            } else {
                dzu[j] = -rcj + dzl[j] + atdy;
            }
        }
    }

    #ifndef NDEBUG
    // Check solution for free and fixed variables.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            assert(dxl[j] == 0.0 && dxu[j] == 0.0);
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
        }
        if (iterate_->StateOf(j) == Iterate::State::free)
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
    }
    #endif
}